

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O3

int c1f5kf_(int *ido,int *l1,int *na,double *cc,int *in1,double *ch,int *in2,double *wa)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  double *pdVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  double *pdVar13;
  long lVar14;
  double *pdVar15;
  ulong uVar16;
  double *pdVar17;
  long lVar18;
  long lVar19;
  double *pdVar20;
  double *pdVar21;
  long lVar22;
  double *pdVar23;
  double *pdVar24;
  double *pdVar25;
  int iVar26;
  double *pdVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double *local_168;
  double *local_160;
  double *local_158;
  double *local_118;
  double *local_110;
  double *local_108;
  double *local_100;
  double *local_f8;
  double *local_f0;
  double *local_e8;
  double *local_e0;
  double *local_d8;
  double *local_d0;
  
  uVar1 = *ido;
  uVar16 = (ulong)uVar1;
  iVar26 = uVar1 * 5 + 1;
  lVar14 = (long)*in1;
  uVar2 = *l1;
  uVar9 = (ulong)uVar2;
  uVar5 = (uVar1 + 1) * uVar2;
  lVar18 = (long)(int)(~uVar5 * *in1 + -1);
  lVar22 = (long)*in2;
  uVar3 = uVar2 * 6;
  lVar19 = (long)(int)(~uVar3 * *in2 + -1);
  if ((int)uVar1 < 2) {
    dVar31 = 1.0 / (double)(int)(uVar2 * 5);
    if (*na == 1) {
      if (0 < (int)uVar2) {
        pdVar7 = ch + ((ulong)(uVar2 * 9) + 1) * lVar22 + 1;
        pdVar13 = ch + ((long)(int)(uVar2 * 8) + 1) * lVar22 + 1;
        pdVar17 = ch + ((ulong)(uVar2 * 10) + 1) * lVar22 + 2;
        pdVar21 = ch + ((ulong)(uVar2 * 7) + 1) * lVar22 + 2;
        pdVar20 = ch + ((ulong)uVar3 + 1) * lVar22 + 2;
        pdVar23 = cc + ((long)(int)uVar5 + 1) * lVar14 + 2;
        pdVar25 = cc + ((long)(int)((uVar1 * 4 + 1) * uVar2) + 1) * lVar14 + 2;
        pdVar27 = cc + ((long)(int)((uVar1 * 3 + 1) * uVar2) + 1) * lVar14 + 2;
        pdVar15 = cc + ((long)(int)(iVar26 * uVar2) + 1) * lVar14 + 2;
        pdVar24 = cc + ((long)(int)((uVar1 * 2 + 1) * uVar2) + 1) * lVar14 + 2;
        do {
          dVar39 = pdVar24[lVar18] - pdVar15[lVar18];
          dVar29 = pdVar24[lVar18] + pdVar15[lVar18];
          dVar38 = pdVar27[lVar18] - pdVar25[lVar18];
          dVar30 = pdVar27[lVar18] + pdVar25[lVar18];
          dVar41 = pdVar24[lVar18 + -1] - pdVar15[lVar18 + -1];
          dVar37 = pdVar24[lVar18 + -1] + pdVar15[lVar18 + -1];
          dVar40 = pdVar27[lVar18 + -1] - pdVar25[lVar18 + -1];
          dVar36 = pdVar27[lVar18 + -1] + pdVar25[lVar18 + -1];
          pdVar20[lVar19 + -1] = (pdVar23[lVar18 + -1] + dVar37 + dVar36) * dVar31;
          pdVar20[lVar19] = (pdVar23[lVar18] + dVar29 + dVar30) * dVar31;
          dVar35 = pdVar23[lVar18 + -1];
          dVar28 = pdVar23[lVar18];
          dVar33 = dVar36 * -0.8090169943749475 + dVar37 * 0.3090169943749474 + dVar35;
          dVar32 = dVar30 * -0.8090169943749475 + dVar29 * 0.3090169943749474 + dVar28;
          dVar42 = dVar41 * -0.9510565162951536 + dVar40 * -0.5877852522924731;
          dVar34 = dVar39 * -0.9510565162951536 + dVar38 * -0.5877852522924731;
          pdVar21[lVar19 + -1] = (dVar33 - dVar34) * dVar31;
          pdVar17[lVar19 + -1] = (dVar34 + dVar33) * dVar31;
          pdVar21[lVar19] = (dVar42 + dVar32) * dVar31;
          dVar35 = dVar36 * 0.3090169943749474 + dVar37 * -0.8090169943749475 + dVar35;
          dVar33 = dVar41 * -0.5877852522924731 + dVar40 * 0.9510565162951536;
          dVar34 = dVar39 * -0.5877852522924731 + dVar38 * 0.9510565162951536;
          dVar28 = dVar30 * 0.3090169943749474 + dVar29 * -0.8090169943749475 + dVar28;
          pdVar13[lVar19] = (dVar35 - dVar34) * dVar31;
          (pdVar13 + lVar19)[1] = (dVar33 + dVar28) * dVar31;
          pdVar7[lVar19] = (dVar35 + dVar34) * dVar31;
          (pdVar7 + lVar19)[1] = (dVar28 - dVar33) * dVar31;
          pdVar17[lVar19] = (dVar32 - dVar42) * dVar31;
          pdVar7 = pdVar7 + lVar22;
          pdVar13 = pdVar13 + lVar22;
          pdVar17 = pdVar17 + lVar22;
          pdVar21 = pdVar21 + lVar22;
          pdVar20 = pdVar20 + lVar22;
          pdVar23 = pdVar23 + lVar14;
          pdVar25 = pdVar25 + lVar14;
          pdVar27 = pdVar27 + lVar14;
          pdVar15 = pdVar15 + lVar14;
          pdVar24 = pdVar24 + lVar14;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
    }
    else if (0 < (int)uVar2) {
      pdVar7 = cc + ((long)(int)uVar5 + 1) * lVar14 + 1;
      pdVar13 = cc + ((long)(int)((uVar1 * 4 + 1) * uVar2) + 1) * lVar14 + 1;
      pdVar15 = cc + ((long)(int)((uVar1 * 3 + 1) * uVar2) + 1) * lVar14 + 1;
      pdVar17 = cc + ((long)(int)(iVar26 * uVar2) + 1) * lVar14 + 1;
      pdVar20 = cc + ((long)(int)((uVar1 * 2 + 1) * uVar2) + 1) * lVar14 + 1;
      do {
        dVar35 = pdVar20[lVar18];
        dVar28 = (pdVar20 + lVar18)[1];
        dVar29 = pdVar17[lVar18];
        dVar30 = (pdVar17 + lVar18)[1];
        dVar37 = dVar35 - dVar29;
        dVar38 = dVar28 - dVar30;
        dVar32 = pdVar15[lVar18];
        dVar33 = (pdVar15 + lVar18)[1];
        dVar34 = pdVar13[lVar18];
        dVar36 = (pdVar13 + lVar18)[1];
        dVar39 = dVar32 - dVar34;
        dVar40 = dVar33 - dVar36;
        dVar35 = dVar35 + dVar29;
        dVar28 = dVar28 + dVar30;
        dVar32 = dVar32 + dVar34;
        dVar33 = dVar33 + dVar36;
        dVar29 = pdVar7[lVar18];
        dVar30 = (pdVar7 + lVar18)[1];
        dVar42 = dVar32 * -0.8090169943749475 + dVar35 * 0.3090169943749474 + dVar29;
        dVar36 = dVar33 * -0.8090169943749475 + dVar28 * 0.3090169943749474 + dVar30;
        pdVar7[lVar18] = (dVar35 + dVar29 + dVar32) * dVar31;
        (pdVar7 + lVar18)[1] = (dVar28 + dVar30 + dVar33) * dVar31;
        dVar41 = dVar37 * -0.9510565162951536 + dVar39 * -0.5877852522924731;
        dVar34 = dVar38 * -0.9510565162951536 + dVar40 * -0.5877852522924731;
        pdVar20[lVar18] = (dVar42 - dVar34) * dVar31;
        pdVar17[lVar18] = (dVar34 + dVar42) * dVar31;
        pdVar20[lVar18 + 1] = (dVar41 + dVar36) * dVar31;
        dVar35 = dVar32 * 0.3090169943749474 + dVar35 * -0.8090169943749475 + dVar29;
        dVar29 = dVar37 * -0.5877852522924731 + dVar39 * 0.9510565162951536;
        dVar32 = dVar38 * -0.5877852522924731 + dVar40 * 0.9510565162951536;
        dVar28 = dVar33 * 0.3090169943749474 + dVar28 * -0.8090169943749475 + dVar30;
        pdVar15[lVar18] = (dVar35 - dVar32) * dVar31;
        (pdVar15 + lVar18)[1] = (dVar29 + dVar28) * dVar31;
        pdVar13[lVar18] = (dVar35 + dVar32) * dVar31;
        (pdVar13 + lVar18)[1] = (dVar28 - dVar29) * dVar31;
        pdVar17[lVar18 + 1] = (dVar36 - dVar41) * dVar31;
        pdVar7 = pdVar7 + lVar14;
        pdVar13 = pdVar13 + lVar14;
        pdVar15 = pdVar15 + lVar14;
        pdVar17 = pdVar17 + lVar14;
        pdVar20 = pdVar20 + lVar14;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
    }
  }
  else {
    uVar4 = uVar1 * 5;
    uVar12 = ~uVar4;
    lVar8 = (long)(int)uVar2;
    if (0 < (int)uVar2) {
      pdVar7 = ch + ((ulong)(uVar2 * 9) + 1) * lVar22 + 1;
      pdVar20 = ch + ((long)(int)(uVar2 * 8) + 1) * lVar22 + 1;
      pdVar21 = ch + ((ulong)(uVar2 * 10) + 1) * lVar22 + 2;
      pdVar15 = ch + ((ulong)(uVar2 * 7) + 1) * lVar22 + 2;
      pdVar13 = ch + ((ulong)uVar3 + 1) * lVar22 + 2;
      pdVar25 = cc + ((ulong)uVar5 + 1) * lVar14 + 2;
      pdVar27 = cc + ((long)(int)((uVar1 * 4 + 1) * uVar2) + 1) * lVar14 + 2;
      pdVar23 = cc + ((ulong)((uVar1 * 3 + 1) * uVar2) + 1) * lVar14 + 2;
      pdVar24 = cc + ((ulong)(iVar26 * uVar2) + 1) * lVar14 + 2;
      pdVar17 = cc + ((long)(int)((uVar1 * 2 + 1) * uVar2) + 1) * lVar14 + 2;
      do {
        dVar34 = pdVar17[lVar18] - pdVar24[lVar18];
        dVar28 = pdVar17[lVar18] + pdVar24[lVar18];
        dVar33 = pdVar23[lVar18] - pdVar27[lVar18];
        dVar39 = pdVar23[lVar18] + pdVar27[lVar18];
        dVar37 = pdVar17[lVar18 + -1] - pdVar24[lVar18 + -1];
        dVar32 = pdVar17[lVar18 + -1] + pdVar24[lVar18 + -1];
        dVar36 = pdVar23[lVar18 + -1] - pdVar27[lVar18 + -1];
        dVar30 = pdVar23[lVar18 + -1] + pdVar27[lVar18 + -1];
        pdVar13[lVar19 + -1] = pdVar25[lVar18 + -1] + dVar32 + dVar30;
        pdVar13[lVar19] = pdVar25[lVar18] + dVar28 + dVar39;
        dVar31 = pdVar25[lVar18 + -1];
        dVar35 = pdVar25[lVar18];
        dVar41 = dVar30 * -0.8090169943749475 + dVar32 * 0.3090169943749474 + dVar31;
        dVar40 = dVar39 * -0.8090169943749475 + dVar28 * 0.3090169943749474 + dVar35;
        dVar38 = dVar37 * -0.9510565162951536 + dVar36 * -0.5877852522924731;
        dVar29 = dVar34 * -0.9510565162951536 + dVar33 * -0.5877852522924731;
        pdVar15[lVar19 + -1] = dVar41 - dVar29;
        pdVar21[lVar19 + -1] = dVar29 + dVar41;
        pdVar15[lVar19] = dVar38 + dVar40;
        dVar31 = dVar30 * 0.3090169943749474 + dVar32 * -0.8090169943749475 + dVar31;
        dVar29 = dVar37 * -0.5877852522924731 + dVar36 * 0.9510565162951536;
        dVar30 = dVar34 * -0.5877852522924731 + dVar33 * 0.9510565162951536;
        dVar35 = dVar39 * 0.3090169943749474 + dVar28 * -0.8090169943749475 + dVar35;
        pdVar20[lVar19] = dVar31 - dVar30;
        (pdVar20 + lVar19)[1] = dVar29 + dVar35;
        pdVar7[lVar19] = dVar31 + dVar30;
        (pdVar7 + lVar19)[1] = dVar35 - dVar29;
        pdVar21[lVar19] = dVar40 - dVar38;
        pdVar7 = pdVar7 + lVar22;
        pdVar20 = pdVar20 + lVar22;
        pdVar21 = pdVar21 + lVar22;
        pdVar15 = pdVar15 + lVar22;
        pdVar13 = pdVar13 + lVar22;
        pdVar25 = pdVar25 + lVar14;
        pdVar27 = pdVar27 + lVar14;
        pdVar23 = pdVar23 + lVar14;
        pdVar24 = pdVar24 + lVar14;
        pdVar17 = pdVar17 + lVar14;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
    }
    local_d0 = ch + (lVar8 * 0xf + 1) * lVar22 + 2;
    local_d8 = ch + (lVar8 * 0xe | 1U) * lVar22 + 2;
    local_e0 = ch + (lVar8 * 0xd + 1) * lVar22 + 2;
    local_e8 = ch + (lVar8 * 0xc + 1) * lVar22 + 2;
    local_f0 = ch + (lVar8 * 0xb + 1) * lVar22 + 2;
    local_f8 = cc + ((uVar16 + 2) * lVar8 + 1) * lVar14 + 2;
    local_100 = cc + (((long)(int)(uVar1 * 4) | 2U) * lVar8 + 1) * lVar14 + 2;
    local_108 = cc + (((ulong)(uVar1 * 3) + 2) * lVar8 + 1) * lVar14 + 2;
    local_110 = cc + (((ulong)uVar4 + 2) * lVar8 + 1) * lVar14 + 2;
    local_118 = cc + (((long)(int)(uVar1 * 2) + 2) * lVar8 + 1) * lVar14 + 2;
    lVar6 = lVar8 * lVar22;
    lVar8 = lVar8 * lVar14;
    uVar9 = 2;
    do {
      if (0 < (int)uVar2) {
        lVar10 = uVar4 + uVar9;
        local_158 = local_e0;
        local_160 = local_d8;
        local_168 = local_d0;
        lVar11 = (ulong)(uVar2 + 1) - 1;
        pdVar7 = local_f0;
        pdVar13 = local_f8;
        pdVar15 = local_108;
        pdVar17 = local_110;
        pdVar20 = local_100;
        pdVar21 = local_e8;
        pdVar23 = local_118;
        do {
          dVar31 = pdVar15[lVar18 + -1];
          dVar35 = pdVar20[lVar18 + -1];
          dVar30 = pdVar23[lVar18] + pdVar17[lVar18];
          dVar29 = pdVar15[lVar18] + pdVar20[lVar18];
          dVar28 = pdVar23[lVar18] - pdVar17[lVar18];
          dVar36 = pdVar23[lVar18 + -1] + pdVar17[lVar18 + -1];
          dVar32 = dVar31 + dVar35;
          dVar37 = pdVar15[lVar18] - pdVar20[lVar18];
          dVar33 = pdVar23[lVar18 + -1] - pdVar17[lVar18 + -1];
          pdVar7[lVar19 + -1] = pdVar13[lVar18 + -1] + dVar36 + dVar32;
          dVar31 = dVar31 - dVar35;
          pdVar7[lVar19] = pdVar13[lVar18] + dVar30 + dVar29;
          dVar34 = dVar32 * -0.8090169943749475 + dVar36 * 0.3090169943749474 + pdVar13[lVar18 + -1]
          ;
          dVar39 = dVar29 * -0.8090169943749475 + dVar30 * 0.3090169943749474 + pdVar13[lVar18];
          dVar38 = dVar33 * -0.9510565162951536 + dVar31 * -0.5877852522924731;
          dVar35 = dVar28 * -0.9510565162951536 + dVar37 * -0.5877852522924731;
          dVar32 = dVar32 * 0.3090169943749474 + dVar36 * -0.8090169943749475 + pdVar13[lVar18 + -1]
          ;
          dVar33 = dVar33 * -0.5877852522924731 + dVar31 * 0.9510565162951536;
          dVar31 = dVar28 * -0.5877852522924731 + dVar37 * 0.9510565162951536;
          dVar29 = dVar29 * 0.3090169943749474 + dVar30 * -0.8090169943749475 + pdVar13[lVar18];
          dVar30 = dVar35 + dVar34;
          dVar34 = dVar34 - dVar35;
          dVar36 = dVar39 - dVar38;
          dVar38 = dVar38 + dVar39;
          pdVar21[lVar19 + -1] =
               wa[(int)uVar12 + lVar10] * dVar34 +
               wa[(long)(int)uVar12 + uVar16 * 9 + uVar9] * dVar38;
          dVar28 = dVar33 + dVar29;
          dVar35 = dVar32 - dVar31;
          pdVar21[lVar19] =
               dVar38 * wa[(int)uVar12 + lVar10] -
               dVar34 * wa[(long)(int)uVar12 + uVar16 * 9 + uVar9];
          local_158[lVar19 + -1] =
               wa[(long)(int)uVar12 + uVar16 * 6 + uVar9] * dVar35 +
               wa[(long)(int)uVar12 + uVar16 * 10 + uVar9] * dVar28;
          dVar29 = dVar29 - dVar33;
          local_158[lVar19] =
               dVar28 * wa[(long)(int)uVar12 + uVar16 * 6 + uVar9] -
               dVar35 * wa[(long)(int)uVar12 + uVar16 * 10 + uVar9];
          dVar31 = dVar31 + dVar32;
          local_160[lVar19 + -1] =
               wa[(long)(int)uVar12 + uVar16 * 7 + uVar9] * dVar31 +
               wa[(long)(int)uVar12 + uVar16 * 0xb + uVar9] * dVar29;
          local_160[lVar19] =
               dVar29 * wa[(long)(int)uVar12 + uVar16 * 7 + uVar9] -
               dVar31 * wa[(long)(int)uVar12 + uVar16 * 0xb + uVar9];
          local_168[lVar19 + -1] =
               wa[(long)(int)uVar12 + (long)(int)(uVar1 * 8) + uVar9] * dVar30 +
               wa[(long)(int)uVar12 + uVar16 * 0xc + uVar9] * dVar36;
          local_168[lVar19] =
               dVar36 * wa[(long)(int)uVar12 + (long)(int)(uVar1 * 8) + uVar9] -
               dVar30 * wa[(long)(int)uVar12 + uVar16 * 0xc + uVar9];
          local_158 = local_158 + lVar22;
          pdVar21 = pdVar21 + lVar22;
          local_160 = local_160 + lVar22;
          pdVar7 = pdVar7 + lVar22;
          pdVar13 = pdVar13 + lVar14;
          pdVar20 = pdVar20 + lVar14;
          local_168 = local_168 + lVar22;
          pdVar15 = pdVar15 + lVar14;
          pdVar17 = pdVar17 + lVar14;
          pdVar23 = pdVar23 + lVar14;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      uVar9 = uVar9 + 1;
      local_d0 = local_d0 + lVar6 * 5;
      local_d8 = local_d8 + lVar6 * 5;
      local_e0 = local_e0 + lVar6 * 5;
      local_e8 = local_e8 + lVar6 * 5;
      local_f0 = local_f0 + lVar6 * 5;
      local_f8 = local_f8 + lVar8;
      local_100 = local_100 + lVar8;
      local_108 = local_108 + lVar8;
      local_110 = local_110 + lVar8;
      local_118 = local_118 + lVar8;
    } while (uVar9 != uVar1 + 1);
  }
  return 0;
}

Assistant:

int c1f5kf_(int *ido, int *l1, int *na, fft_real_t *cc,
	 int *in1, fft_real_t *ch, int *in2, fft_real_t *wa)
{
    /* Initialized data */

     fft_real_t tr11 = .3090169943749474;
     fft_real_t ti11 = -.9510565162951536;
     fft_real_t tr12 = -.8090169943749474;
     fft_real_t ti12 = -.5877852522924731;

    /* System generated locals */
    int cc_dim1, cc_dim2, cc_dim3, cc_offset, ch_dim1, ch_dim2, ch_offset,
	     wa_dim1, wa_offset, i__1, i__2;

    /* Local variables */
     int i__, k;
     fft_real_t sn, ci2, ci3, ci4, ci5, di3, di4, di5, di2, cr2, cr3, cr5,
	    cr4, dr3, dr4, ti2, ti3, ti4, ti5, dr5, dr2, tr2, tr3, tr4, tr5,
	    chold1, chold2;

    /* Parameter adjustments */
    wa_dim1 = *ido;
    wa_offset = 1 + wa_dim1 * 5;
    wa -= wa_offset;
    cc_dim1 = *in1;
    cc_dim2 = *l1;
    cc_dim3 = *ido;
    cc_offset = 1 + cc_dim1 * (1 + cc_dim2 * (1 + cc_dim3));
    cc -= cc_offset;
    ch_dim1 = *in2;
    ch_dim2 = *l1;
    ch_offset = 1 + ch_dim1 * (1 + ch_dim2 * 6);
    ch -= ch_offset;

    /* Function Body */

/* FFTPACK 5.1 auxiliary routine */

    if (*ido > 1) {
	goto L102;
    }
    sn = 1.0 / (fft_real_t) (*l1 * 5);
    if (*na == 1) {
	goto L106;
    }
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	ti5 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 2] - cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 2];
	ti2 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 2] + cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 2];
	ti4 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 2] - cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 2];
	ti3 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 2] + cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 2];
	tr5 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 1] - cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 1];
	tr2 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 1] + cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 1];
	tr4 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 1] - cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 1];
	tr3 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 1] + cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 1];
	chold1 = sn * (cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] + tr2
		+ tr3);
	chold2 = sn * (cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] + ti2
		+ ti3);
	cr2 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] + tr11 * tr2 +
		tr12 * tr3;
	ci2 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] + tr11 * ti2 +
		tr12 * ti3;
	cr3 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] + tr12 * tr2 +
		tr11 * tr3;
	ci3 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] + tr12 * ti2 +
		tr11 * ti3;
	cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] = chold1;
	cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] = chold2;
	cr5 = ti11 * tr5 + ti12 * tr4;
	ci5 = ti11 * ti5 + ti12 * ti4;
	cr4 = ti12 * tr5 - ti11 * tr4;
	ci4 = ti12 * ti5 - ti11 * ti4;
	cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 1] = sn * (cr2 -
		ci5);
	cc[(k + (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 1] = sn * (cr2 + ci5)
		;
	cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 2] = sn * (ci2 +
		cr5);
	cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 2] = sn * (ci3 + cr4)
		;
	cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 1] = sn * (cr3 - ci4)
		;
	cc[(k + ((cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 1] = sn * (cr3 +
		ci4);
	cc[(k + ((cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 2] = sn * (ci3 -
		cr4);
	cc[(k + (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 2] = sn * (ci2 - cr5)
		;
/* L101: */
    }
    return 0;
L106:
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	ti5 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 2] - cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 2];
	ti2 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 2] + cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 2];
	ti4 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 2] - cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 2];
	ti3 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 2] + cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 2];
	tr5 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 1] - cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 1];
	tr2 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 1] + cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 1];
	tr4 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 1] - cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 1];
	tr3 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 1] + cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 1];
	ch[(k + ch_dim2 * 6) * ch_dim1 + 1] = sn * (cc[(k + (cc_dim3 + 1) *
		cc_dim2) * cc_dim1 + 1] + tr2 + tr3);
	ch[(k + ch_dim2 * 6) * ch_dim1 + 2] = sn * (cc[(k + (cc_dim3 + 1) *
		cc_dim2) * cc_dim1 + 2] + ti2 + ti3);
	cr2 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] + tr11 * tr2 +
		tr12 * tr3;
	ci2 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] + tr11 * ti2 +
		tr12 * ti3;
	cr3 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] + tr12 * tr2 +
		tr11 * tr3;
	ci3 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] + tr12 * ti2 +
		tr11 * ti3;
	cr5 = ti11 * tr5 + ti12 * tr4;
	ci5 = ti11 * ti5 + ti12 * ti4;
	cr4 = ti12 * tr5 - ti11 * tr4;
	ci4 = ti12 * ti5 - ti11 * ti4;
	ch[(k + ch_dim2 * 7) * ch_dim1 + 1] = sn * (cr2 - ci5);
	ch[(k + ch_dim2 * 10) * ch_dim1 + 1] = sn * (cr2 + ci5);
	ch[(k + ch_dim2 * 7) * ch_dim1 + 2] = sn * (ci2 + cr5);
	ch[(k + (ch_dim2 << 3)) * ch_dim1 + 2] = sn * (ci3 + cr4);
	ch[(k + (ch_dim2 << 3)) * ch_dim1 + 1] = sn * (cr3 - ci4);
	ch[(k + ch_dim2 * 9) * ch_dim1 + 1] = sn * (cr3 + ci4);
	ch[(k + ch_dim2 * 9) * ch_dim1 + 2] = sn * (ci3 - cr4);
	ch[(k + ch_dim2 * 10) * ch_dim1 + 2] = sn * (ci2 - cr5);
/* L107: */
    }
    return 0;
L102:
    i__1 = *l1;
    for (k = 1; k <= i__1; ++k) {
	ti5 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 2] - cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 2];
	ti2 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 2] + cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 2];
	ti4 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 2] - cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 2];
	ti3 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 2] + cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 2];
	tr5 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 1] - cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 1];
	tr2 = cc[(k + ((cc_dim3 << 1) + 1) * cc_dim2) * cc_dim1 + 1] + cc[(k
		+ (cc_dim3 * 5 + 1) * cc_dim2) * cc_dim1 + 1];
	tr4 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 1] - cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 1];
	tr3 = cc[(k + (cc_dim3 * 3 + 1) * cc_dim2) * cc_dim1 + 1] + cc[(k + ((
		cc_dim3 << 2) + 1) * cc_dim2) * cc_dim1 + 1];
	ch[(k + ch_dim2 * 6) * ch_dim1 + 1] = cc[(k + (cc_dim3 + 1) * cc_dim2)
		 * cc_dim1 + 1] + tr2 + tr3;
	ch[(k + ch_dim2 * 6) * ch_dim1 + 2] = cc[(k + (cc_dim3 + 1) * cc_dim2)
		 * cc_dim1 + 2] + ti2 + ti3;
	cr2 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] + tr11 * tr2 +
		tr12 * tr3;
	ci2 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] + tr11 * ti2 +
		tr12 * ti3;
	cr3 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] + tr12 * tr2 +
		tr11 * tr3;
	ci3 = cc[(k + (cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] + tr12 * ti2 +
		tr11 * ti3;
	cr5 = ti11 * tr5 + ti12 * tr4;
	ci5 = ti11 * ti5 + ti12 * ti4;
	cr4 = ti12 * tr5 - ti11 * tr4;
	ci4 = ti12 * ti5 - ti11 * ti4;
	ch[(k + ch_dim2 * 7) * ch_dim1 + 1] = cr2 - ci5;
	ch[(k + ch_dim2 * 10) * ch_dim1 + 1] = cr2 + ci5;
	ch[(k + ch_dim2 * 7) * ch_dim1 + 2] = ci2 + cr5;
	ch[(k + (ch_dim2 << 3)) * ch_dim1 + 2] = ci3 + cr4;
	ch[(k + (ch_dim2 << 3)) * ch_dim1 + 1] = cr3 - ci4;
	ch[(k + ch_dim2 * 9) * ch_dim1 + 1] = cr3 + ci4;
	ch[(k + ch_dim2 * 9) * ch_dim1 + 2] = ci3 - cr4;
	ch[(k + ch_dim2 * 10) * ch_dim1 + 2] = ci2 - cr5;
/* L103: */
    }
    i__1 = *ido;
    for (i__ = 2; i__ <= i__1; ++i__) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    ti5 = cc[(k + (i__ + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 2] -
		    cc[(k + (i__ + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 2];
	    ti2 = cc[(k + (i__ + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 2] +
		    cc[(k + (i__ + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 2];
	    ti4 = cc[(k + (i__ + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 2] - cc[(
		    k + (i__ + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 2];
	    ti3 = cc[(k + (i__ + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 2] + cc[(
		    k + (i__ + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 2];
	    tr5 = cc[(k + (i__ + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1] -
		    cc[(k + (i__ + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1];
	    tr2 = cc[(k + (i__ + (cc_dim3 << 1)) * cc_dim2) * cc_dim1 + 1] +
		    cc[(k + (i__ + cc_dim3 * 5) * cc_dim2) * cc_dim1 + 1];
	    tr4 = cc[(k + (i__ + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] - cc[(
		    k + (i__ + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1];
	    tr3 = cc[(k + (i__ + cc_dim3 * 3) * cc_dim2) * cc_dim1 + 1] + cc[(
		    k + (i__ + (cc_dim3 << 2)) * cc_dim2) * cc_dim1 + 1];
	    ch[(k + (i__ * 5 + 1) * ch_dim2) * ch_dim1 + 1] = cc[(k + (i__ +
		    cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr2 + tr3;
	    ch[(k + (i__ * 5 + 1) * ch_dim2) * ch_dim1 + 2] = cc[(k + (i__ +
		    cc_dim3) * cc_dim2) * cc_dim1 + 2] + ti2 + ti3;
	    cr2 = cc[(k + (i__ + cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr11 *
		    tr2 + tr12 * tr3;
	    ci2 = cc[(k + (i__ + cc_dim3) * cc_dim2) * cc_dim1 + 2] + tr11 *
		    ti2 + tr12 * ti3;
	    cr3 = cc[(k + (i__ + cc_dim3) * cc_dim2) * cc_dim1 + 1] + tr12 *
		    tr2 + tr11 * tr3;
	    ci3 = cc[(k + (i__ + cc_dim3) * cc_dim2) * cc_dim1 + 2] + tr12 *
		    ti2 + tr11 * ti3;
	    cr5 = ti11 * tr5 + ti12 * tr4;
	    ci5 = ti11 * ti5 + ti12 * ti4;
	    cr4 = ti12 * tr5 - ti11 * tr4;
	    ci4 = ti12 * ti5 - ti11 * ti4;
	    dr3 = cr3 - ci4;
	    dr4 = cr3 + ci4;
	    di3 = ci3 + cr4;
	    di4 = ci3 - cr4;
	    dr5 = cr2 + ci5;
	    dr2 = cr2 - ci5;
	    di5 = ci2 - cr5;
	    di2 = ci2 + cr5;
	    ch[(k + (i__ * 5 + 2) * ch_dim2) * ch_dim1 + 1] = wa[i__ +
		    wa_dim1 * 5] * dr2 + wa[i__ + wa_dim1 * 9] * di2;
	    ch[(k + (i__ * 5 + 2) * ch_dim2) * ch_dim1 + 2] = wa[i__ +
		    wa_dim1 * 5] * di2 - wa[i__ + wa_dim1 * 9] * dr2;
	    ch[(k + (i__ * 5 + 3) * ch_dim2) * ch_dim1 + 1] = wa[i__ +
		    wa_dim1 * 6] * dr3 + wa[i__ + wa_dim1 * 10] * di3;
	    ch[(k + (i__ * 5 + 3) * ch_dim2) * ch_dim1 + 2] = wa[i__ +
		    wa_dim1 * 6] * di3 - wa[i__ + wa_dim1 * 10] * dr3;
	    ch[(k + (i__ * 5 + 4) * ch_dim2) * ch_dim1 + 1] = wa[i__ +
		    wa_dim1 * 7] * dr4 + wa[i__ + wa_dim1 * 11] * di4;
	    ch[(k + (i__ * 5 + 4) * ch_dim2) * ch_dim1 + 2] = wa[i__ +
		    wa_dim1 * 7] * di4 - wa[i__ + wa_dim1 * 11] * dr4;
	    ch[(k + (i__ * 5 + 5) * ch_dim2) * ch_dim1 + 1] = wa[i__ + (
		    wa_dim1 << 3)] * dr5 + wa[i__ + wa_dim1 * 12] * di5;
	    ch[(k + (i__ * 5 + 5) * ch_dim2) * ch_dim1 + 2] = wa[i__ + (
		    wa_dim1 << 3)] * di5 - wa[i__ + wa_dim1 * 12] * dr5;
/* L104: */
	}
/* L105: */
    }
    return 0;
}